

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_pred.c
# Opt level: O3

void uavs3d_if_hor_ver_chroma
               (pel *src,int i_src,pel *dst,int i_dst,int width,int height,s8 *coeff_h,s8 *coeff_v,
               int max_val)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  byte bVar5;
  undefined2 uVar6;
  ushort uVar7;
  ushort uVar8;
  uint uVar9;
  sbyte sVar10;
  sbyte sVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  byte bVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  uint uVar19;
  uint uVar20;
  byte bVar21;
  uint uVar22;
  long lVar23;
  int iVar24;
  byte *pbVar25;
  undefined1 *puVar26;
  undefined1 *puVar27;
  undefined1 *puVar28;
  undefined1 *puVar29;
  bool bVar30;
  undefined1 uVar32;
  undefined1 auVar31 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  byte local_4348;
  undefined1 local_4338 [2];
  undefined1 auStack_4336 [17158];
  
  sVar10 = (max_val != 0xff) * '\x02';
  cVar1 = (max_val == 0xff) * '\x02';
  sVar11 = cVar1 + 10;
  iVar24 = 1 << cVar1 + 9;
  pbVar25 = src + -i_src;
  if (max_val == 0xff) {
    if (height < -2) {
      return;
    }
    puVar27 = local_4338;
    iVar14 = -1;
    do {
      if (0 < width) {
        uVar6 = *(undefined2 *)coeff_h;
        uVar32 = (undefined1)((ushort)uVar6 >> 8);
        auVar31 = psraw(ZEXT416(CONCAT22((short)(CONCAT13(uVar32,CONCAT12(uVar32,uVar6)) >> 0x10),
                                         CONCAT11((char)uVar6,(char)uVar6))),8);
        in_XMM2 = pshuflw(in_XMM2,auVar31,0xe1);
        auVar33 = pshuflw(ZEXT416((uint)(int)coeff_h[2]),ZEXT416((uint)(int)coeff_h[2]),0);
        auVar34 = pshuflw(ZEXT416((uint)(int)coeff_h[3]),ZEXT416((uint)(int)coeff_h[3]),0);
        lVar18 = 0;
        bVar15 = pbVar25[-2];
        bVar21 = *pbVar25;
        uVar7 = *(ushort *)(pbVar25 + 2);
        do {
          uVar8 = *(ushort *)(pbVar25 + lVar18 + 4);
          *(uint *)(puVar27 + lVar18 * 2) =
               CONCAT22((uVar8 >> 8) * auVar34._2_2_ + (uVar7 >> 8) * auVar33._2_2_ +
                        (ushort)pbVar25[lVar18 + 1] * auVar31._2_2_ +
                        (ushort)pbVar25[lVar18 + -1] * in_XMM2._2_2_,
                        (uVar8 & 0xff) * auVar34._0_2_ + (uVar7 & 0xff) * auVar33._0_2_ +
                        (ushort)bVar15 * auVar31._0_2_ + (ushort)bVar21 * in_XMM2._0_2_);
          lVar18 = lVar18 + 2;
          local_4348 = (byte)uVar7;
          bVar15 = bVar21;
          bVar21 = local_4348;
          uVar7 = uVar8;
        } while (lVar18 < width);
      }
      pbVar25 = pbVar25 + i_src;
      puVar27 = puVar27 + (long)width * 2;
      bVar30 = iVar14 != height + 1;
      iVar14 = iVar14 + 1;
    } while (bVar30);
  }
  else {
    if (height < -2) {
      return;
    }
    uVar19 = (uint)(1 << sVar10) >> 1;
    puVar27 = local_4338;
    iVar14 = -1;
    do {
      if (0 < width) {
        cVar1 = *coeff_h;
        cVar2 = coeff_h[1];
        cVar3 = coeff_h[2];
        cVar4 = coeff_h[3];
        bVar15 = pbVar25[2];
        uVar12 = (uint)pbVar25[3];
        lVar18 = 0;
        uVar20 = (uint)*pbVar25;
        uVar22 = (uint)pbVar25[-2];
        do {
          uVar9 = uVar20;
          uVar20 = (uint)bVar15;
          bVar15 = pbVar25[lVar18 + 4];
          bVar21 = pbVar25[lVar18 + 1];
          iVar13 = uVar12 * (int)cVar3;
          bVar5 = pbVar25[lVar18 + -1];
          uVar12 = (uint)pbVar25[lVar18 + 5];
          *(short *)(puVar27 + lVar18 * 2) =
               (short)((int)(uVar22 * (int)cVar1 + uVar19 + uVar20 * (int)cVar3 + uVar9 * (int)cVar2
                            + (uint)bVar15 * (int)cVar4) >> sVar10);
          *(short *)(puVar27 + lVar18 * 2 + 2) =
               (short)((int)((uint)bVar5 * (int)cVar1 + uVar19 + iVar13 + (uint)bVar21 * (int)cVar2
                            + uVar12 * (int)cVar4) >> sVar10);
          lVar18 = lVar18 + 2;
          uVar22 = uVar9;
        } while (lVar18 < width);
      }
      pbVar25 = pbVar25 + i_src;
      puVar27 = puVar27 + (long)width * 2;
      bVar30 = iVar14 != height + 1;
      iVar14 = iVar14 + 1;
    } while (bVar30);
  }
  if (0 < height) {
    lVar17 = (long)width;
    lVar18 = lVar17 * 2;
    puVar28 = auStack_4336 + (long)(width * 2) * 2 + lVar17 * 2;
    puVar29 = auStack_4336 + lVar17 * 4;
    puVar26 = auStack_4336 + lVar17 * 2;
    iVar14 = 0;
    puVar27 = local_4338;
    do {
      if (0 < width) {
        lVar23 = 0;
        do {
          iVar13 = (int)*(short *)(puVar27 + lVar23 * 2) * (int)*coeff_v + iVar24 +
                   (int)*(short *)(puVar29 + lVar23 * 2 + -2) * (int)coeff_v[2] +
                   (int)*(short *)(puVar26 + lVar23 * 2 + -2) * (int)coeff_v[1] +
                   (int)*(short *)(puVar28 + lVar23 * 2 + -2) * (int)coeff_v[3] >> sVar11;
          iVar16 = (int)*(short *)(puVar27 + lVar23 * 2 + 2) * (int)*coeff_v + iVar24 +
                   (int)*(short *)(puVar29 + lVar23 * 2) * (int)coeff_v[2] +
                   (int)*(short *)(puVar26 + lVar23 * 2) * (int)coeff_v[1] +
                   (int)*(short *)(puVar28 + lVar23 * 2) * (int)coeff_v[3] >> sVar11;
          if (max_val <= iVar13) {
            iVar13 = max_val;
          }
          if (iVar13 < 1) {
            iVar13 = 0;
          }
          dst[lVar23] = (pel)iVar13;
          if (max_val <= iVar16) {
            iVar16 = max_val;
          }
          if (iVar16 < 1) {
            iVar16 = 0;
          }
          dst[lVar23 + 1] = (pel)iVar16;
          lVar23 = lVar23 + 2;
        } while (lVar23 < lVar17);
      }
      dst = dst + i_dst;
      iVar14 = iVar14 + 1;
      puVar28 = puVar28 + lVar18;
      puVar29 = puVar29 + lVar18;
      puVar27 = puVar27 + lVar18;
      puVar26 = puVar26 + lVar18;
    } while (iVar14 != height);
  }
  return;
}

Assistant:

static void uavs3d_if_hor_ver_chroma(const pel *src, int i_src, pel *dst, int i_dst, int width, int height, const s8 *coeff_h, const s8 *coeff_v, int max_val)
{
    int row, col;
    int sumu, sumv, valu, valv;
    int add1, shift1;
    int add2, shift2;

    ALIGNED_16(s16 tmp_res[(64 + 3) * 64 * 2]); // UV interlaced
    s16 *tmp;

    if (max_val == 255) { // 8 bit_depth
        shift1 = 0;
        shift2 = 12;
    }
    else { // 10 bit_depth
        shift1 = 2;
        shift2 = 10;
    }

    add1 = (1 << (shift1)) >> 1;
    add2 = 1 << (shift2 - 1);

    src += -1 * i_src;
    tmp = tmp_res;

    if (shift1) {
        for (row = -1; row < height + 2; row++) {
            for (col = 0; col < width; col += 2) {
                sumu = FLT_4TAP_HOR(src, col, coeff_h);
                sumv = FLT_4TAP_HOR(src, col + 1, coeff_h);
                tmp[col] = (sumu + add1) >> shift1;
                tmp[col + 1] = (sumv + add1) >> shift1;
            }
            src += i_src;
            tmp += width;
        }
    }
    else {
        for (row = -1; row < height + 2; row++) {
            for (col = 0; col < width; col += 2) {
                tmp[col] = FLT_4TAP_HOR(src, col, coeff_h);
                tmp[col + 1] = FLT_4TAP_HOR(src, col + 1, coeff_h);
            }
            src += i_src;
            tmp += width;
        }
    }

    tmp = tmp_res + 1 * width;

    for (row = 0; row < height; row++) {
        for (col = 0; col < width; col += 2) {
            sumu = FLT_4TAP_VER(tmp, col, width, coeff_v);
            sumv = FLT_4TAP_VER(tmp, col + 1, width, coeff_v);
            valu = (sumu + add2) >> shift2;
            valv = (sumv + add2) >> shift2;
            dst[col] = COM_CLIP3(0, max_val, valu);
            dst[col + 1] = COM_CLIP3(0, max_val, valv);
        }
        dst += i_dst;
        tmp += width;
    }
}